

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O0

int archive_read_support_format_ar(archive *_a)

{
  int iVar1;
  void *__s;
  int magic_test;
  int r;
  ar *ar;
  archive_read *a;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_format_ar");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    __s = malloc(0x38);
    if (__s == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate ar data");
      _a_local._4_4_ = -0x1e;
    }
    else {
      memset(__s,0,0x38);
      *(undefined8 *)((long)__s + 0x20) = 0;
      _a_local._4_4_ =
           __archive_read_register_format
                     ((archive_read *)_a,__s,"ar",archive_read_format_ar_bid,
                      (_func_int_archive_read_ptr_char_ptr_char_ptr *)0x0,
                      archive_read_format_ar_read_header,archive_read_format_ar_read_data,
                      archive_read_format_ar_skip,(_func_int64_t_archive_read_ptr_int64_t_int *)0x0,
                      archive_read_format_ar_cleanup,(_func_int_archive_read_ptr *)0x0,
                      (_func_int_archive_read_ptr *)0x0);
      if (_a_local._4_4_ == 0) {
        _a_local._4_4_ = 0;
      }
      else {
        free(__s);
      }
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_support_format_ar(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct ar *ar;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_ar");

	ar = (struct ar *)malloc(sizeof(*ar));
	if (ar == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ar data");
		return (ARCHIVE_FATAL);
	}
	memset(ar, 0, sizeof(*ar));
	ar->strtab = NULL;

	r = __archive_read_register_format(a,
	    ar,
	    "ar",
	    archive_read_format_ar_bid,
	    NULL,
	    archive_read_format_ar_read_header,
	    archive_read_format_ar_read_data,
	    archive_read_format_ar_skip,
	    NULL,
	    archive_read_format_ar_cleanup,
	    NULL,
	    NULL);

	if (r != ARCHIVE_OK) {
		free(ar);
		return (r);
	}
	return (ARCHIVE_OK);
}